

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void startCapture(CaptureBody *capture)

{
  uint32_t uVar1;
  CaptureBody *capture_local;
  
  if (((lexerState->capturing ^ 0xffU) & 1) == 0) {
    __assert_fail("!lexerState->capturing",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x990,"startCapture");
  }
  lexerState->capturing = true;
  lexerState->captureSize = 0;
  lexerState->disableMacroArgs = true;
  lexerState->disableInterpolation = true;
  uVar1 = lexer_GetLineNo();
  capture->lineNo = uVar1;
  if (((lexerState->isMmapped & 1U) == 0) || (lexerState->expansions != (Expansion *)0x0)) {
    lexerState->captureCapacity = 0x80;
    if (lexerState->captureBuf != (char *)0x0) {
      __assert_fail("lexerState->captureBuf == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x99c,"startCapture");
    }
    reallocCaptureBuf();
    capture->body = (char *)0x0;
  }
  else {
    capture->body = (lexerState->field_2).field_0.ptr + (lexerState->field_2).field_0.offset;
  }
  return;
}

Assistant:

static void startCapture(struct CaptureBody *capture)
{
	assert(!lexerState->capturing);
	lexerState->capturing = true;
	lexerState->captureSize = 0;
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	capture->lineNo = lexer_GetLineNo();

	if (lexerState->isMmapped && !lexerState->expansions) {
		capture->body = &lexerState->ptr[lexerState->offset];
	} else {
		lexerState->captureCapacity = 128; // The initial size will be twice that
		assert(lexerState->captureBuf == NULL);
		reallocCaptureBuf();
		capture->body = NULL; // Indicate to retrieve the capture buffer when done capturing
	}
}